

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O0

int __thiscall sptk::reaper::FFT::makefttable(FFT *this,int pow2)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double dVar7;
  double dVar8;
  double arg;
  double scl;
  float *s;
  float *c;
  int lm;
  int lmx;
  float *local_28;
  float *local_20;
  int local_14;
  
  *(int *)((long)in_RDI + 0x1c) = 1 << ((byte)in_ESI & 0x1f);
  iVar6 = *(int *)((long)in_RDI + 0x1c) / 2;
  *(int *)(in_RDI + 2) = iVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar6;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_RDI = pvVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar6;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[1] = pvVar5;
  iVar1 = *(int *)((long)in_RDI + 0x1c);
  local_28 = (float *)*in_RDI;
  local_20 = (float *)in_RDI[1];
  for (local_14 = 0; local_14 < iVar6; local_14 = local_14 + 1) {
    dVar7 = (6.283185307179586 / (double)iVar1) * (double)local_14;
    dVar8 = sin(dVar7);
    *local_28 = (float)dVar8;
    dVar7 = cos(dVar7);
    *local_20 = (float)dVar7;
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
  }
  *(int *)(in_RDI + 3) = (*(int *)(in_RDI + 2) << 1) / *(int *)((long)in_RDI + 0x1c);
  *(undefined4 *)((long)in_RDI + 0x14) = in_ESI;
  return *(int *)(in_RDI + 2);
}

Assistant:

int FFT::makefttable(int pow2) {
  int lmx, lm;
  float *c, *s;
  double scl, arg;

  fftSize = 1 << pow2;
  fft_ftablesize = lmx = fftSize/2;
  fsine = new float[lmx];
  fcosine = new float[lmx];
  scl = (M_PI * 2.0) / fftSize;
  for (s = fsine, c = fcosine, lm = 0; lm < lmx; ++lm) {
    arg = scl * lm;
    *s++ = sin(arg);
    *c++ = cos(arg);
  }
  kbase = (fft_ftablesize * 2) / fftSize;
  power2 = pow2;
  return(fft_ftablesize);
}